

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O0

int run_test_check_ref(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int64_t eval_b;
  int64_t eval_a;
  uv_check_t h;
  
  uVar2 = uv_default_loop();
  uv_check_init(uVar2,&eval_a);
  uv_check_start(&eval_a,fail_cb2);
  uv_unref(&eval_a);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  do_close(&eval_a);
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ref.c"
            ,0x97,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(check_ref) {
  uv_check_t h;
  uv_check_init(uv_default_loop(), &h);
  uv_check_start(&h, (uv_check_cb) fail_cb2);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}